

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall
cfd::core::ByteData160::ByteData160
          (ByteData160 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vector)

{
  size_type sVar1;
  undefined8 uVar2;
  ByteData160 *__n;
  CfdError error_code;
  CfdException *this_00;
  allocator local_71;
  string local_70 [32];
  size_type local_50;
  CfdSourceLocation local_48;
  undefined1 local_19 [9];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vector_local;
  ByteData160 *this_local;
  
  this_00 = (CfdException *)local_19;
  __n = this;
  local_19._1_8_ = vector;
  vector_local = &this->data_;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x401e8f);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)__n,
             (allocator_type *)this);
  error_code = (CfdError)((ulong)__n >> 0x20);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x401eac);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_19._1_8_);
  if (sVar1 != 0x14) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_bytedata.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0xbf;
    local_48.funcname = "ByteData160";
    local_50 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_19._1_8_);
    logger::warn<unsigned_long>(&local_48,"ByteData160 size unmatch. size={}.",&local_50);
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_70,"ByteData160 size unmatch.",&local_71);
    CfdException::CfdException(this_00,error_code,(string *)this);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_19._1_8_);
  return;
}

Assistant:

ByteData160::ByteData160(const std::vector<uint8_t>& vector)
    : data_(std::vector<uint8_t>(kByteData160Length)) {
  if (vector.size() != kByteData160Length) {
    warn(CFD_LOG_SOURCE, "ByteData160 size unmatch. size={}.", vector.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ByteData160 size unmatch.");
  }
  data_ = vector;
}